

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

BufferViewWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateBufferView
          (BufferViewWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkBufferViewCreateInfo *BuffViewCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (BuffViewCI->sType != VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO) {
    Diligent::FormatString<char[26],char[62]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BuffViewCI.sType == VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO",
               (char (*) [62])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateBufferView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xc6);
    std::__cxx11::string::~string((string *)&local_48);
  }
  CreateVulkanObject<VkBufferView_T*,(VulkanUtilities::VulkanHandleTypeId)3,VkResult(*)(VkDevice_T*,VkBufferViewCreateInfo_const*,VkAllocationCallbacks_const*,VkBufferView_T**),VkBufferViewCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkBufferViewCreateInfo_ptr_VkAllocationCallbacks_ptr_VkBufferView_T_ptr_ptr
              *)vkCreateBufferView,BuffViewCI,DebugName,"buffer view");
  return __return_storage_ptr__;
}

Assistant:

BufferViewWrapper VulkanLogicalDevice::CreateBufferView(const VkBufferViewCreateInfo& BuffViewCI,
                                                        const char*                   DebugName) const
{
    VERIFY_EXPR(BuffViewCI.sType == VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO);
    return CreateVulkanObject<VkBufferView, VulkanHandleTypeId::BufferView>(vkCreateBufferView, BuffViewCI, DebugName, "buffer view");
}